

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_end(nk_context *ctx)

{
  nk_rect *pnVar1;
  nk_panel **ppnVar2;
  nk_command_buffer *b;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  nk_color c;
  uint uVar7;
  nk_window *pnVar8;
  nk_panel *pnVar9;
  nk_window *pnVar10;
  nk_user_font *font;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var11;
  undefined1 auVar12 [16];
  nk_vec2 nVar13;
  bool bVar14;
  nk_panel *pnVar15;
  int iVar16;
  int iVar17;
  nk_panel *pnVar18;
  long lVar19;
  uint uVar20;
  nk_window *pnVar21;
  nk_panel *pnVar22;
  uint *puVar23;
  nk_panel_type nVar24;
  nk_page_element *pe;
  nk_context *i;
  bool bVar25;
  float fVar26;
  float fVar27;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  nk_rect r;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect scroll;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_rect r_00;
  nk_rect b_00;
  nk_flags local_11c;
  undefined1 local_118 [8];
  undefined4 uStack_110;
  undefined4 uStack_10c;
  nk_vec2 local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  nk_flags state;
  float fStack_e4;
  float local_e0;
  float local_dc;
  undefined1 local_d8 [8];
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined1 local_c8 [16];
  nk_rect local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  nk_rect empty_east;
  nk_rect local_40;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x492f,"void nk_end(struct nk_context *)");
  }
  pnVar8 = ctx->current;
  if (pnVar8 == (nk_window *)0x0) {
    __assert_fail("ctx->current && \"if this triggers you forgot to call `nk_begin`\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4930,"void nk_end(struct nk_context *)");
  }
  pnVar9 = pnVar8->layout;
  if ((pnVar9 == (nk_panel *)0x0) ||
     ((nVar24 = pnVar9->type, nVar24 == NK_PANEL_WINDOW && ((pnVar8->flags & 0x2000) != 0))))
  goto LAB_0012b233;
  b = &pnVar8->buffer;
  uVar20 = pnVar9->flags;
  i = (nk_context *)0x0;
  if ((uVar20 & 0x1400) == 0) {
    i = ctx;
  }
  if ((nVar24 & (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
                NK_PANEL_GROUP)) == 0) {
    r.w = 16384.0;
    r.h = 16384.0;
    r.x = -8192.0;
    r.y = -8192.0;
    nk_push_scissor(b,r);
    nVar24 = pnVar9->type;
    uVar20 = pnVar9->flags;
  }
  local_108 = (ctx->style).window.scrollbar_size;
  uStack_100 = 0;
  nVar13 = nk_panel_get_padding(&ctx->style,nVar24);
  auVar12._8_4_ = extraout_XMM0_Dc;
  auVar12._0_4_ = nVar13.x;
  auVar12._4_4_ = nVar13.y;
  auVar12._12_4_ = extraout_XMM0_Dd;
  fVar26 = (pnVar9->row).height + pnVar9->at_y;
  pnVar9->at_y = fVar26;
  local_f8 = auVar12;
  if ((uVar20 & 0x8800) == 0x800) {
    fVar27 = (pnVar9->bounds).y;
    if (fVar26 < (pnVar9->bounds).h + fVar27) {
      (pnVar9->bounds).h = fVar26 - fVar27;
    }
    local_f8._4_4_ = nVar13.y;
    rect.y = fVar27;
    rect.x = (pnVar8->bounds).x;
    rect.h = (float)local_f8._4_4_;
    rect.w = (pnVar8->bounds).w;
    nk_fill_rect(b,rect,0.0,(ctx->style).window.background);
    rect_00.w = pnVar9->border + (float)local_f8._0_4_;
    rect_00.y = (pnVar9->bounds).y;
    rect_00.x = (pnVar8->bounds).x;
    rect_00.h = (pnVar9->bounds).h;
    nk_fill_rect(b,rect_00,0.0,(ctx->style).window.background);
    rect_01.x = ((pnVar9->bounds).x + (pnVar9->bounds).w) - pnVar9->border;
    fVar26 = pnVar9->border + (float)local_f8._0_4_;
    if ((*pnVar9->offset_y == 0) && ((pnVar9->flags & 0x20) == 0)) {
      fVar26 = fVar26 + local_108.x;
    }
    rect_01.y = (pnVar9->bounds).y;
    rect_01.h = (pnVar9->bounds).h;
    rect_01.w = fVar26;
    nk_fill_rect(b,rect_01,0.0,(ctx->style).window.background);
    uVar20 = pnVar9->flags;
    if ((uVar20 & 0x20) == 0 && *pnVar9->offset_x != 0) {
      rect_02.y = (pnVar9->bounds).y + (pnVar9->bounds).h;
      rect_02.x = (pnVar8->bounds).x;
      rect_02.h = local_108.y;
      rect_02.w = (pnVar8->bounds).w;
      nk_fill_rect(b,rect_02,0.0,(ctx->style).window.background);
      uVar20 = pnVar9->flags;
    }
  }
  if (((uVar20 & 0x8020) == 0) &&
     (pnVar8->scrollbar_hiding_timer <= 4.0 && pnVar8->scrollbar_hiding_timer != 4.0)) {
    if ((pnVar9->type &
        (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
        NK_PANEL_GROUP)) == 0) {
      if (pnVar8 == ctx->active) {
        bVar25 = pnVar9->has_scrolling != 0;
      }
      else {
        bVar25 = false;
      }
      if (i == (nk_context *)0x0) {
LAB_0012a7c0:
        uVar20 = 0;
      }
      else {
        uVar20 = 1;
        bVar14 = bVar25;
        if ((i->input).mouse.scroll_delta.y <= 0.0) {
          bVar14 = (bool)(0.0 < (i->input).mouse.scroll_delta.x & bVar25);
        }
        if (bVar14 == false) goto LAB_0012a7c0;
      }
      pnVar8->scrolled = uVar20;
    }
    else {
      pnVar22 = pnVar8->layout;
      pnVar15 = pnVar22;
      do {
        pnVar18 = pnVar15;
        pnVar15 = pnVar18->parent;
        pnVar10 = pnVar8;
      } while (pnVar18->parent != (nk_panel *)0x0);
      do {
        pnVar21 = pnVar10;
        pnVar10 = pnVar21->parent;
      } while (pnVar10 != (nk_window *)0x0);
      if ((pnVar21 == ctx->active) && (pnVar9->has_scrolling != 0)) {
        pnVar1 = &pnVar9->bounds;
        uVar3 = pnVar1->x;
        uVar5 = pnVar1->y;
        local_118._4_4_ = uVar5;
        local_118._0_4_ = uVar3;
        uVar4 = (pnVar9->bounds).w;
        uVar6 = (pnVar9->bounds).h;
        local_d8._4_4_ = uVar6;
        local_d8._0_4_ = uVar4;
        _uStack_110 = 0;
        _uStack_d0 = 0;
        iVar16 = nk_input_is_mouse_hovering_rect(&i->input,*pnVar1);
        if (iVar16 != 0) {
          fVar26 = (pnVar18->clip).x;
          if (((((float)local_118._0_4_ + (float)local_d8._0_4_ < fVar26) ||
               (fVar26 + (pnVar18->clip).w < (float)local_118._0_4_)) ||
              (fVar26 = (pnVar18->clip).y, (float)local_d8._4_4_ + (float)local_118._4_4_ < fVar26))
             || (fVar26 + (pnVar18->clip).h < (float)local_118._4_4_)) goto LAB_0012a6c8;
          do {
            ppnVar2 = &pnVar22->parent;
            pnVar22->has_scrolling = 0;
            bVar25 = true;
            pnVar22 = *ppnVar2;
          } while (*ppnVar2 != (nk_panel *)0x0);
          goto LAB_0012a7ca;
        }
      }
LAB_0012a6c8:
      bVar25 = false;
    }
LAB_0012a7ca:
    _state = _state & 0xffffffff00000000;
    fVar26 = (pnVar9->bounds).y;
    scroll.x = (pnVar9->bounds).x + (pnVar9->bounds).w + (float)local_f8._0_4_;
    fVar27 = (pnVar9->bounds).h;
    scroll.y = fVar26;
    scroll.h = fVar27;
    scroll.w = local_108.x;
    fVar26 = nk_do_scrollbarv(&state,b,scroll,(uint)bVar25,(float)*pnVar9->offset_y,
                              (float)(int)(pnVar9->at_y - fVar26),fVar27 * 0.1,fVar27 * 0.01,
                              &(ctx->style).scrollv,&i->input,(ctx->style).font);
    *pnVar9->offset_y = (nk_uint)(long)fVar26;
    if ((i != (nk_context *)0x0) && (bVar25 != false)) {
      (i->input).mouse.scroll_delta.y = 0.0;
    }
    local_11c = 0;
    fVar26 = (pnVar9->bounds).x;
    fVar31 = (pnVar9->bounds).y + (pnVar9->bounds).h;
    fVar27 = pnVar9->max_x;
    fVar29 = (float)(int)(fVar27 - fVar26);
    font = (ctx->style).font;
    local_dc = 1.0;
    if (1.0 <= local_108.y) {
      local_dc = local_108.y;
    }
    fVar32 = local_dc + local_dc;
    fVar28 = (pnVar9->bounds).w;
    local_e0 = fVar32;
    if (fVar32 <= fVar28) {
      local_e0 = fVar28;
    }
    _state = CONCAT44(fVar31,fVar26);
    fVar28 = 0.0;
    if (local_e0 < fVar29) {
      fVar30 = (float)*pnVar9->offset_x;
      fVar28 = fVar27 * 0.05;
      local_c8 = ZEXT416((uint)fVar29);
      local_118._0_4_ = local_e0;
      local_118._4_4_ = 0;
      uStack_110 = 0;
      uStack_10c = 0;
      local_d8._4_4_ = 0;
      uStack_d0 = 0;
      uStack_cc = 0;
      empty_east.y = fVar31;
      empty_east.h = local_dc;
      if ((ctx->style).scrollh.show_buttons != 0) {
        local_78 = ZEXT416((uint)fVar32);
        local_a8 = ZEXT416((uint)fVar31);
        _local_118 = ZEXT416((uint)local_e0);
        _local_d8 = ZEXT416((uint)fVar26);
        fVar29 = fVar28;
        if (fVar27 * 0.005 <= fVar28) {
          fVar29 = fVar27 * 0.005;
        }
        local_98 = ZEXT416((uint)local_dc);
        local_68 = CONCAT44(fVar31,fVar26);
        uStack_60 = 0;
        bounds.y = fVar31;
        bounds.x = fVar26;
        bounds.h = local_dc;
        bounds.w = local_dc;
        local_88 = local_dc;
        fStack_84 = local_dc;
        fStack_80 = local_dc;
        fStack_7c = local_dc;
        iVar16 = nk_do_button_symbol((nk_flags *)&local_b8,b,bounds,(ctx->style).scrollh.dec_symbol,
                                     NK_BUTTON_REPEATER,&(ctx->style).scrollh.dec_button,&i->input,
                                     font);
        fVar26 = 0.0;
        if (iVar16 != 0) {
          fVar26 = fVar29;
        }
        fVar30 = fVar30 - fVar26;
        fVar26 = (float)local_d8._0_4_ + (float)local_118._0_4_;
        local_118._0_4_ = (float)local_118._0_4_ - (float)local_78._0_4_;
        bounds_00.h = fStack_84;
        bounds_00.w = local_88;
        bounds_00.y = (float)local_68._4_4_;
        bounds_00.x = fVar26 - (float)local_98._0_4_;
        iVar16 = nk_do_button_symbol((nk_flags *)&local_b8,b,bounds_00,
                                     (ctx->style).scrollh.inc_symbol,NK_BUTTON_REPEATER,
                                     &(ctx->style).scrollh.inc_button,&i->input,font);
        if (iVar16 != 0) {
          fVar30 = fVar30 + fVar29;
        }
        fVar26 = (float)local_d8._0_4_ + (float)local_98._0_4_;
        _state = CONCAT44(fStack_e4,fVar26);
        fVar29 = (float)local_c8._0_4_;
        empty_east.y = (float)local_a8._0_4_;
        empty_east.h = (float)local_98._0_4_;
      }
      if ((float)local_118._0_4_ <= fVar28) {
        fVar28 = (float)local_118._0_4_;
      }
      if (fVar29 - (float)local_118._0_4_ <= fVar30) {
        fVar30 = fVar29 - (float)local_118._0_4_;
      }
      fVar27 = 0.0;
      if (0.0 <= fVar30) {
        fVar27 = fVar30;
      }
      fVar31 = (ctx->style).scrollh.border;
      nVar13 = (ctx->style).scrollh.padding;
      fVar32 = nVar13.x;
      fVar30 = nVar13.y;
      local_b8.x = (fVar27 / fVar29) * (float)local_118._0_4_ + fVar26 + fVar31 + fVar32;
      local_b8.y = empty_east.y + fVar31 + fVar30;
      local_b8.w = ((float)local_118._0_4_ / fVar29) * (float)local_118._0_4_ -
                   (fVar32 + fVar32 + fVar31 + fVar31);
      local_b8.h = empty_east.h - (fVar30 + fVar30 + fVar31 + fVar31);
      local_d8._0_4_ = fVar26;
      empty_east.x = local_b8.w + local_b8.x;
      local_40.w = local_b8.x - fVar26;
      empty_east.w = (fVar26 + (float)local_118._0_4_) - empty_east.x;
      local_e0 = (float)local_118._0_4_;
      local_40.x = fVar26;
      local_40.y = empty_east.y;
      local_40.h = empty_east.h;
      fVar28 = nk_scrollbar_behavior
                         (&local_11c,&i->input,(uint)bVar25,(nk_rect *)&state,&local_b8,&local_40,
                          &empty_east,fVar27,fVar29,fVar28,NK_HORIZONTAL);
      local_b8.x = (fVar28 / (float)local_c8._0_4_) * (float)local_118._0_4_ + (float)local_d8._0_4_
      ;
      p_Var11 = (ctx->style).scrollh.draw_begin;
      if (p_Var11 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var11)(b,(nk_handle)(ctx->style).scrollh.userdata.ptr);
      }
      nk_draw_scrollbar(b,local_11c,&(ctx->style).scrollh,(nk_rect *)&state,&local_b8);
      p_Var11 = (ctx->style).scrollh.draw_end;
      if (p_Var11 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var11)(b,(nk_handle)(ctx->style).scrollh.userdata.ptr);
      }
    }
    *pnVar9->offset_x = (nk_uint)(long)fVar28;
  }
  if ((pnVar8->flags & 0x80) == 0) {
LAB_0012ac53:
    pnVar8->scrollbar_hiding_timer = 0.0;
  }
  else {
    fVar26 = (ctx->input).mouse.delta.x;
    if (((fVar26 != 0.0) || (NAN(fVar26))) ||
       ((fVar26 = (ctx->input).mouse.delta.y, fVar26 != 0.0 || (NAN(fVar26))))) {
      bVar25 = false;
    }
    else {
      bVar25 = (ctx->input).mouse.scroll_delta.y == 0.0;
    }
    iVar16 = nk_window_is_hovered(ctx);
    if ((!(bool)(bVar25 & iVar16 != 0)) && (iVar16 != 0 || (ctx->last_widget_state & 2) != 0))
    goto LAB_0012ac53;
    pnVar8->scrollbar_hiding_timer = ctx->delta_time_seconds + pnVar8->scrollbar_hiding_timer;
  }
  uVar20 = pnVar9->flags;
  if ((uVar20 & 1) != 0) {
    nVar24 = pnVar9->type;
    if (nVar24 == NK_PANEL_TOOLTIP) {
LAB_0012acfe:
      lVar19 = 0x1cd4;
    }
    else if (nVar24 == NK_PANEL_POPUP) {
      lVar19 = 0x1cc8;
    }
    else if (nVar24 == NK_PANEL_CONTEXTUAL) {
      lVar19 = 0x1cd0;
    }
    else if (nVar24 == NK_PANEL_COMBO) {
      lVar19 = 0x1ccc;
    }
    else {
      if (nVar24 == NK_PANEL_MENU) goto LAB_0012acfe;
      lVar19 = 0x1cc4;
      if (nVar24 == NK_PANEL_GROUP) {
        lVar19 = 0x1cd8;
      }
    }
    c = *(nk_color *)((long)(ctx->style).cursors + lVar19 + -8);
    if ((short)uVar20 < 0) {
      fVar26 = (pnVar8->bounds).y;
      fVar27 = (ctx->style).window.border + fVar26 + pnVar9->header_height;
    }
    else if ((uVar20 >> 0xb & 1) == 0) {
      fVar26 = (pnVar8->bounds).y;
      fVar27 = (pnVar8->bounds).h + fVar26;
    }
    else {
      fVar27 = (pnVar9->bounds).y + (pnVar9->bounds).h + pnVar9->footer_height;
      fVar26 = (pnVar8->bounds).y;
    }
    fVar29 = (pnVar8->bounds).x;
    nk_stroke_line(b,fVar29,fVar26,(pnVar8->bounds).w + fVar29,fVar26,pnVar9->border,c);
    fVar26 = (pnVar8->bounds).x;
    nk_stroke_line(b,fVar26,fVar27,(pnVar8->bounds).w + fVar26,fVar27,pnVar9->border,c);
    fVar26 = pnVar9->border * 0.5 + (pnVar8->bounds).x;
    nk_stroke_line(b,fVar26,(pnVar8->bounds).y,fVar26,fVar27,pnVar9->border,c);
    fVar26 = ((pnVar8->bounds).x + (pnVar8->bounds).w) - pnVar9->border * 0.5;
    nk_stroke_line(b,fVar26,(pnVar8->bounds).y,fVar26,fVar27,pnVar9->border,c);
    uVar20 = pnVar9->flags;
  }
  if ((i != (nk_context *)0x0) && ((uVar20 & 0x8004) == 4)) {
    fVar26 = (pnVar9->bounds).x;
    fVar27 = (pnVar9->bounds).y + (pnVar9->bounds).h;
    if ((uVar20 >> 9 & 1) == 0) {
      local_f8._0_4_ = fVar26 + (pnVar9->bounds).w + (float)local_f8._0_4_;
    }
    else {
      local_f8._0_4_ = fVar26 + (float)local_f8._0_4_ * -0.5;
    }
    if ((uVar20 & 0x20) != 0) {
      local_f8._0_4_ = (float)local_f8._0_4_ - local_108.x;
    }
    local_f8._4_4_ = fVar27;
    local_f8._8_8_ = 0;
    if ((ctx->style).window.scaler.type == NK_STYLE_ITEM_IMAGE) {
      r_00.y = fVar27;
      r_00.x = (float)local_f8._0_4_;
      r_00.w = local_108.x;
      r_00.h = local_108.y;
      nk_draw_image(b,r_00,&(ctx->style).window.scaler.data.image,(nk_color)0xffffffff);
    }
    else {
      fVar29 = local_108.x + (float)local_f8._0_4_;
      fVar26 = (float)local_f8._0_4_;
      if ((uVar20 >> 9 & 1) == 0) {
        fVar26 = fVar29;
        fVar29 = (float)local_f8._0_4_;
      }
      nk_fill_triangle(b,fVar26,fVar27,fVar26,local_108.y + fVar27,fVar29,local_108.y + fVar27,
                       (ctx->style).window.scaler.data.color);
    }
    auVar12 = local_f8;
    if ((pnVar8->flags & 0x1000) == 0) {
      fVar26 = (ctx->style).window.min_size.x;
      local_118._0_4_ = (ctx->style).window.min_size.y;
      iVar16 = (i->input).mouse.buttons[0].down;
      b_00.w = local_108.x;
      b_00.h = local_108.y;
      b_00.x = (float)local_f8._0_4_;
      b_00.y = (float)local_f8._4_4_;
      local_f8 = auVar12;
      iVar17 = nk_input_has_mouse_click_down_in_rect(&i->input,NK_BUTTON_LEFT,b_00,1);
      uVar20 = pnVar9->flags;
      if ((iVar16 != 0) && (iVar17 != 0)) {
        fVar27 = (i->input).mouse.delta.x;
        fVar29 = fVar27;
        if ((uVar20 >> 9 & 1) != 0) {
          fVar29 = -fVar27;
          (pnVar8->bounds).x = (pnVar8->bounds).x + fVar27;
        }
        fVar28 = (pnVar8->bounds).w + fVar29;
        fVar31 = (float)local_f8._0_4_;
        if ((fVar26 <= fVar28) &&
           ((fVar29 < 0.0 || ((0.0 < fVar29 && ((float)local_f8._0_4_ <= (i->input).mouse.pos.x)))))
           ) {
          (pnVar8->bounds).w = fVar28;
          fVar31 = fVar27 + (float)local_f8._0_4_;
        }
        fVar26 = (float)local_f8._4_4_;
        if ((uVar20 >> 0xb & 1) == 0) {
          fVar27 = (i->input).mouse.delta.y;
          fVar29 = (pnVar8->bounds).h + fVar27;
          if (((float)local_118._0_4_ < fVar29) &&
             ((fVar27 < 0.0 || ((0.0 < fVar27 && ((float)local_f8._4_4_ <= (i->input).mouse.pos.y)))
              ))) {
            (pnVar8->bounds).h = fVar29;
            fVar26 = fVar27 + (float)local_f8._4_4_;
          }
        }
        (ctx->style).cursor_active = (ctx->style).cursors[6];
        nVar13.y = local_108.y * 0.5 + fVar26;
        nVar13.x = local_108.x * 0.5 + fVar31;
        (i->input).mouse.buttons[0].clicked_pos = nVar13;
      }
    }
    else {
      uVar20 = pnVar9->flags;
    }
  }
  if ((pnVar9->type &
      (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
      NK_PANEL_GROUP)) == 0) {
    if ((uVar20 >> 0xd & 1) == 0) {
      (pnVar8->buffer).end = (ctx->memory).allocated;
      if ((pnVar8->popup).buf.active != 0) {
        *(nk_size *)((long)(ctx->memory).memory.ptr + (pnVar8->popup).buf.parent + 8) =
             (pnVar8->popup).buf.end;
      }
    }
    else {
      (pnVar8->buffer).last = 0;
      (pnVar8->buffer).begin = 0;
      (pnVar8->buffer).end = 0;
      (pnVar8->buffer).clip = nk_null_rect;
      uVar20 = pnVar9->flags;
    }
  }
  if ((uVar20 >> 0x10 & 1) != 0) {
    uVar20 = uVar20 & 0xfffeefff;
    pnVar9->flags = uVar20;
  }
  pnVar8->flags = uVar20;
  iVar16 = (pnVar8->property).active;
  if (iVar16 == 0) {
    uVar20 = (pnVar8->property).seq;
LAB_0012b146:
    (pnVar8->property).old = uVar20;
    (pnVar8->property).prev = iVar16;
    (pnVar8->property).seq = 0;
  }
  else {
    uVar7 = (pnVar8->property).seq;
    uVar20 = (pnVar8->property).old;
    if ((uVar20 == uVar7) || (uVar20 = uVar7, iVar16 != (pnVar8->property).prev)) goto LAB_0012b146;
    nk_zero(&pnVar8->property,0x68);
  }
  iVar16 = (pnVar8->edit).active;
  if (iVar16 == 0) {
    uVar20 = (pnVar8->edit).seq;
LAB_0012b1a5:
    (pnVar8->edit).old = uVar20;
    (pnVar8->edit).prev = iVar16;
    (pnVar8->edit).seq = 0;
  }
  else {
    uVar7 = (pnVar8->edit).seq;
    uVar20 = (pnVar8->edit).old;
    if ((uVar20 == uVar7) || (uVar20 = uVar7, iVar16 != (pnVar8->edit).prev)) goto LAB_0012b1a5;
    nk_zero(&pnVar8->edit,0x2c);
  }
  if ((pnVar8->popup).active_con == 0) {
    uVar20 = (pnVar8->popup).con_count;
LAB_0012b1f6:
    puVar23 = &(pnVar8->popup).con_count;
    (pnVar8->popup).con_old = uVar20;
  }
  else {
    uVar20 = (pnVar8->popup).con_old;
    if (uVar20 == (pnVar8->popup).con_count) goto LAB_0012b1f6;
    puVar23 = &(pnVar8->popup).active_con;
    (pnVar8->popup).con_count = 0;
    (pnVar8->popup).con_old = 0;
  }
  *puVar23 = 0;
  (pnVar8->popup).combo_count = 0;
  if ((pnVar9->row).tree_depth != 0) {
    __assert_fail("!layout->row.tree_depth",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x474a,"void nk_panel_end(struct nk_context *)");
  }
  nk_free_page_element(ctx,(nk_page_element *)ctx->current->layout);
LAB_0012b233:
  ctx->current = (nk_window *)0x0;
  return;
}

Assistant:

NK_API void
nk_end(struct nk_context *ctx)
{
    struct nk_panel *layout;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current && "if this triggers you forgot to call `nk_begin`");
    if (!ctx || !ctx->current)
        return;

    layout = ctx->current->layout;
    if (!layout || (layout->type == NK_PANEL_WINDOW && (ctx->current->flags & NK_WINDOW_HIDDEN))) {
        ctx->current = 0;
        return;
    }
    nk_panel_end(ctx);
    nk_free_panel(ctx, ctx->current->layout);
    ctx->current = 0;
}